

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O0

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>
          (long *e,undefined8 param_2)

{
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_00;
  rt_expression_interface<double> *prVar1;
  op_unary<viennamath::op_exp<double>,_viennamath::rt_expression_interface<double>_> *this_01;
  op_interface_type *op;
  rt_expression_interface<double> *diff_var_local;
  rt_expression_interface<double> *e_local;
  
  this = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
  this_00 = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x18);
  prVar1 = (rt_expression_interface<double> *)(**(code **)(*e + 0x10))();
  this_01 = (op_unary<viennamath::op_exp<double>,_viennamath::rt_expression_interface<double>_> *)
            operator_new(0x10);
  op_unary<viennamath::op_exp<double>,_viennamath::rt_expression_interface<double>_>::op_unary
            (this_01);
  rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
            (this_00,prVar1,(op_interface_type *)this_01);
  op = (op_interface_type *)operator_new(8);
  op->_vptr_op_interface = (_func_int **)0x0;
  op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>::op_binary
            ((op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_> *
             )op);
  prVar1 = (rt_expression_interface<double> *)(**(code **)(*e + 0x90))(e,param_2);
  rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (this,(rt_expression_interface<double> *)this_00,op,prVar1);
  return &this->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * e, op_exp<NumericT>, const InterfaceType * diff_var)
  {
    return new rt_binary_expr<InterfaceType>( new rt_unary_expr<InterfaceType>(e->clone(), new op_unary<op_exp<NumericT>, InterfaceType>()),
                                           new op_binary<op_mult<typename InterfaceType::numeric_type>, InterfaceType>(),
                                           e->diff(diff_var));
  }